

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O3

void sptk::world::rftfsub(int n,double *a,int nc,double *c)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  uint uVar7;
  double *pdVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  uVar7 = n >> 1;
  if (2 < (int)uVar7) {
    lVar4 = (long)((nc * 2) / (int)uVar7);
    pdVar6 = c + lVar4;
    pdVar5 = c + (nc - lVar4);
    uVar9 = 2;
    pdVar1 = a + (uint)n;
    do {
      pdVar8 = pdVar1 + -2;
      dVar2 = a[uVar9];
      dVar3 = (a + uVar9)[1];
      dVar12 = dVar2 - *pdVar8;
      dVar11 = pdVar1[-1] + dVar3;
      dVar10 = (0.5 - *pdVar5) * dVar12 + -*pdVar6 * dVar11;
      dVar11 = (0.5 - *pdVar5) * dVar11 + *pdVar6 * dVar12;
      a[uVar9] = dVar2 - dVar10;
      (a + uVar9)[1] = dVar3 - dVar11;
      *pdVar8 = *pdVar8 + dVar10;
      pdVar1[-1] = pdVar1[-1] - dVar11;
      uVar9 = uVar9 + 2;
      pdVar6 = pdVar6 + lVar4;
      pdVar5 = pdVar5 + -lVar4;
      pdVar1 = pdVar8;
    } while (uVar9 < uVar7);
  }
  return;
}

Assistant:

void rftfsub(int n, double *a, int nc, double *c) {
  int j, k, kk, ks, m;
  double wkr, wki, xr, xi, yr, yi;

  m = n >> 1;
  ks = 2 * nc / m;
  kk = 0;
  for (j = 2; j < m; j += 2) {
    k = n - j;
    kk += ks;
    wkr = 0.5 - c[nc - kk];
    wki = c[kk];
    xr = a[j] - a[k];
    xi = a[j + 1] + a[k + 1];
    yr = wkr * xr - wki * xi;
    yi = wkr * xi + wki * xr;
    a[j] -= yr;
    a[j + 1] -= yi;
    a[k] += yr;
    a[k + 1] -= yi;
  }
}